

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_dict_deflate(Byte *compr,uLong comprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr;
  char *pcVar6;
  char *__s1;
  undefined4 uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char **unaff_R15;
  uLong auStack_138 [2];
  Byte *pBStack_128;
  char *pcStack_120;
  ulong uStack_110;
  undefined4 uStack_108;
  undefined4 uStack_f0;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  uLong uStack_b0;
  uLong uStack_a0;
  Byte *pBStack_98;
  code *pcStack_90;
  char *local_88;
  int local_80;
  Byte *local_70;
  undefined4 local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  uLong local_28;
  
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uVar7 = 9;
  pcVar6 = (char *)0x70;
  pcStack_90 = (code *)0x103424;
  iVar1 = deflateInit_(&local_88,9,"1.2.8");
  if (iVar1 == 0) {
    uVar7 = 0x104004;
    pcStack_90 = (code *)0x10343c;
    iVar1 = deflateSetDictionary(&local_88,"hello",6);
    if (iVar1 != 0) goto LAB_0010349a;
    dictId = local_28;
    local_68 = (undefined4)comprLen;
    local_88 = hello;
    pcStack_90 = (code *)0x103465;
    local_70 = compr;
    sVar4 = strlen(hello);
    local_80 = (int)sVar4 + 1;
    uVar7 = 4;
    pcStack_90 = (code *)0x103478;
    iVar1 = deflate(&local_88);
    unaff_R15 = &local_88;
    if (iVar1 != 1) goto LAB_001034a1;
    pcStack_90 = (code *)0x103485;
    uVar2 = deflateEnd(&local_88);
    unaff_R15 = &local_88;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_90 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_90 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_90 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX;
  }
  uVar9 = (ulong)uVar2;
  pcStack_90 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  pcVar8 = "1.2.8";
  uStack_110 = uVar9;
  uStack_108 = uVar7;
  uStack_a0 = comprLen;
  pBStack_98 = compr;
  pcStack_90 = (code *)unaff_R15;
  iVar1 = inflateInit_(&uStack_110,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_f0 = SUB84(pcVar6,0);
    pcVar6 = "hello";
    do {
      pcVar8 = (char *)0x0;
      iVar1 = inflate(&uStack_110);
      if (iVar1 == 2) {
        if (uStack_b0 != dictId) {
          test_dict_inflate_cold_2();
          compr = (Byte *)&uStack_110;
          goto LAB_0010358d;
        }
        pcVar8 = "hello";
        iVar1 = inflateSetDictionary(&uStack_110,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_0010354e:
    iVar1 = inflateEnd(&uStack_110);
    compr = (Byte *)&uStack_110;
    if (iVar1 == 0) {
      pcVar8 = hello;
      pcVar10 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar10;
      compr = (Byte *)&uStack_110;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_00;
  }
  test_dict_inflate_cold_3();
LAB_0010359b:
  test_dict_inflate_cold_4();
  auStack_138[0] = 40000;
  pBStack_128 = compr;
  pcStack_120 = pcVar6;
  pcVar6 = (char *)zlibVersion();
  if (*pcVar6 == '1') {
    pcVar6 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar6,"1.2.8");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr,40000);
      if (iVar1 < 2) {
        pcVar6 = "foo.gz";
      }
      else {
        pcVar6 = *(char **)(pcVar8 + 8);
      }
      test_gzio(pcVar6,uncompr,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr,40000);
      test_large_deflate(compr_00,40000,uncompr,40000);
      test_large_inflate(compr_00,40000,uncompr,40000);
      test_flush(compr_00,auStack_138);
      test_sync(compr_00,auStack_138[0],uncompr,40000);
      auStack_138[0] = 40000;
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr,40000);
      free(compr_00);
      free(uncompr);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_dict_deflate(compr, comprLen)
    Byte *compr;
    uLong comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_BEST_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    err = deflateSetDictionary(&c_stream,
                (const Bytef*)dictionary, (int)sizeof(dictionary));
    CHECK_ERR(err, "deflateSetDictionary");

    dictId = c_stream.adler;
    c_stream.next_out = compr;
    c_stream.avail_out = (uInt)comprLen;

    c_stream.next_in = (z_const unsigned char *)hello;
    c_stream.avail_in = (uInt)strlen(hello)+1;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        fprintf(stderr, "deflate should report Z_STREAM_END\n");
        exit(1);
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}